

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

void prepare_coeffs_6tap_avx2(InterpFilterParams *filter_params,int32_t subpel_q4,__m256i *coeffs)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 (*in_RDX) [32];
  uint in_ESI;
  InterpFilterParams *in_RDI;
  undefined1 auVar9 [16];
  __m256i coeff;
  __m128i coeffs_8;
  int16_t *filter;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_100;
  undefined8 uStack_f8;
  
  av1_get_interp_filter_subpel_kernel(in_RDI,in_ESI & 0xf);
  auVar1 = vpinsrd_avx(ZEXT416(0x5040302),0x5040302,1);
  auVar1 = vpinsrd_avx(auVar1,0x5040302,2);
  auVar1 = vpinsrd_avx(auVar1,0x5040302,3);
  auVar2 = vpinsrd_avx(ZEXT416(0x5040302),0x5040302,1);
  auVar2 = vpinsrd_avx(auVar2,0x5040302,2);
  auVar2 = vpinsrd_avx(auVar2,0x5040302,3);
  uStack_1d0 = auVar2._0_8_;
  uStack_1c8 = auVar2._8_8_;
  auVar8._8_8_ = uStack_f8;
  auVar8._0_8_ = local_100;
  auVar8._16_8_ = local_100;
  auVar8._24_8_ = uStack_f8;
  auVar7._16_8_ = uStack_1d0;
  auVar7._0_16_ = auVar1;
  auVar7._24_8_ = uStack_1c8;
  auVar3 = vpshufb_avx2(auVar8,auVar7);
  *in_RDX = auVar3;
  auVar1 = vpinsrd_avx(ZEXT416(0x9080706),0x9080706,1);
  auVar1 = vpinsrd_avx(auVar1,0x9080706,2);
  auVar1 = vpinsrd_avx(auVar1,0x9080706,3);
  auVar2 = vpinsrd_avx(ZEXT416(0x9080706),0x9080706,1);
  auVar2 = vpinsrd_avx(auVar2,0x9080706,2);
  auVar2 = vpinsrd_avx(auVar2,0x9080706,3);
  uStack_190 = auVar2._0_8_;
  uStack_188 = auVar2._8_8_;
  auVar6._8_8_ = uStack_f8;
  auVar6._0_8_ = local_100;
  auVar6._16_8_ = local_100;
  auVar6._24_8_ = uStack_f8;
  auVar5._16_8_ = uStack_190;
  auVar5._0_16_ = auVar1;
  auVar5._24_8_ = uStack_188;
  auVar3 = vpshufb_avx2(auVar6,auVar5);
  in_RDX[1] = auVar3;
  auVar1 = vpinsrd_avx(ZEXT416(0xd0c0b0a),0xd0c0b0a,1);
  auVar1 = vpinsrd_avx(auVar1,0xd0c0b0a,2);
  auVar1 = vpinsrd_avx(auVar1,0xd0c0b0a,3);
  auVar2 = vpinsrd_avx(ZEXT416(0xd0c0b0a),0xd0c0b0a,1);
  auVar2 = vpinsrd_avx(auVar2,0xd0c0b0a,2);
  auVar2 = vpinsrd_avx(auVar2,0xd0c0b0a,3);
  auVar9 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
  uStack_150 = auVar9._0_8_;
  uStack_148 = auVar9._8_8_;
  auVar4._8_8_ = uStack_f8;
  auVar4._0_8_ = local_100;
  auVar4._16_8_ = local_100;
  auVar4._24_8_ = uStack_f8;
  auVar3._16_8_ = uStack_150;
  auVar3._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
  auVar3._24_8_ = uStack_148;
  auVar3 = vpshufb_avx2(auVar4,auVar3);
  in_RDX[2] = auVar3;
  return;
}

Assistant:

static inline void prepare_coeffs_6tap_avx2(
    const InterpFilterParams *const filter_params, const int32_t subpel_q4,
    __m256i *const coeffs /* [3]*/) {
  const int16_t *const filter = av1_get_interp_filter_subpel_kernel(
      filter_params, subpel_q4 & SUBPEL_MASK);
  const __m128i coeffs_8 = _mm_loadu_si128((__m128i *)filter);
  const __m256i coeff = _mm256_broadcastsi128_si256(coeffs_8);

  // coeffs 1 2 1 2 1 2 1 2
  coeffs[0] = _mm256_shuffle_epi8(coeff, _mm256_set1_epi32(0x05040302u));
  // coeffs 3 4 3 4 3 4 3 4
  coeffs[1] = _mm256_shuffle_epi8(coeff, _mm256_set1_epi32(0x09080706u));
  // coeffs 5 6 5 6 5 6 5 6
  coeffs[2] = _mm256_shuffle_epi8(coeff, _mm256_set1_epi32(0x0D0C0B0Au));
}